

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

void htmlstartElementDebug(void *ctx,xmlChar *name,xmlChar **atts)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  uchar *att;
  xmlChar *__s;
  int outlen;
  uchar output [40];
  int local_60;
  int local_5c;
  char local_58 [40];
  
  fprintf((FILE *)SAXdebug,"SAX.startElement(%s",name);
  if ((atts != (xmlChar **)0x0) && (*atts != (xmlChar *)0x0)) {
    lVar3 = 0;
    do {
      fprintf((FILE *)SAXdebug,", %s");
      __s = atts[lVar3 + 1];
      if (__s != (xmlChar *)0x0) {
        fwrite("=\'",2,1,(FILE *)SAXdebug);
        while( true ) {
          sVar2 = strlen((char *)__s);
          local_60 = (int)sVar2;
          if (local_60 < 1) break;
          local_5c = 0x27;
          htmlEncodeEntities(local_58,&local_5c,__s,&local_60,0x27);
          local_58[local_5c] = '\0';
          fputs(local_58,(FILE *)SAXdebug);
          __s = __s + local_60;
        }
        fputc(0x27,(FILE *)SAXdebug);
      }
      lVar1 = lVar3 + 2;
      lVar3 = lVar3 + 2;
    } while (atts[lVar1] != (xmlChar *)0x0);
  }
  fwrite(")\n",2,1,(FILE *)SAXdebug);
  return;
}

Assistant:

static void
htmlstartElementDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name, const xmlChar **atts)
{
    int i;

    fprintf(SAXdebug, "SAX.startElement(%s", (char *) name);
    if (atts != NULL) {
        for (i = 0;(atts[i] != NULL);i++) {
	    fprintf(SAXdebug, ", %s", atts[i++]);
	    if (atts[i] != NULL) {
		unsigned char output[40];
		const unsigned char *att = atts[i];
		int outlen, attlen;
	        fprintf(SAXdebug, "='");
		while ((attlen = strlen((char*)att)) > 0) {
		    outlen = sizeof output - 1;
		    htmlEncodeEntities(output, &outlen, att, &attlen, '\'');
		    output[outlen] = 0;
		    fprintf(SAXdebug, "%s", (char *) output);
		    att += attlen;
		}
		fprintf(SAXdebug, "'");
	    }
	}
    }
    fprintf(SAXdebug, ")\n");
}